

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  _Alloc_hider _Var5;
  uint uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  double value;
  Char buffer [33];
  double local_d0;
  string local_c8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Value local_58;
  
  local_d0 = 0.0;
  uVar6 = (int)token->end_ - (int)token->start_;
  if ((int)uVar6 < 0) {
    paVar7 = &local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"Unable to parse token length","");
    addError(this,&local_c8,token,(Location)0x0);
    _Var5._M_p = local_c8._M_dataplus._M_p;
  }
  else {
    if (uVar6 < 0x21) {
      memcpy(&local_c8,token->start_,(ulong)(uVar6 & 0x3f));
      *(undefined1 *)((long)&local_c8._M_dataplus._M_p + (ulong)(uVar6 & 0x3f)) = 0;
      iVar1 = __isoc99_sscanf(&local_c8,&DAT_0015086e,&local_d0);
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8);
      iVar1 = __isoc99_sscanf(local_c8._M_dataplus._M_p,&DAT_0015086e,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
    }
    if (iVar1 == 1) {
      Value::Value(&local_58,local_d0);
      Value::operator=(decoded,&local_58);
      Value::~Value(&local_58);
      return true;
    }
    paVar7 = &local_68;
    local_78[0] = paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,token->start_,token->end_);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x14a2c4);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_88 = *plVar3;
      lStack_80 = plVar2[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar3;
      local_98 = (long *)*plVar2;
    }
    local_90 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_c8.field_2._M_allocated_capacity = *psVar4;
      local_c8.field_2._8_8_ = plVar2[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar4;
      local_c8._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_c8._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    addError(this,&local_c8,token,(Location)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    _Var5._M_p = (pointer)local_78[0];
    if (local_98 != &local_88) {
      operator_delete(local_98);
      _Var5._M_p = (pointer)local_78[0];
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar7) {
    operator_delete(_Var5._M_p);
  }
  return false;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const int bufferSize = 32;
  int count;
  int length = int(token.end_ - token.start_);

  // Sanity check to avoid buffer overflow exploits.
  if (length < 0) {
    return addError("Unable to parse token length", token);
  }

  // Avoid using a string constant for the format control string given to
  // sscanf, as this can cause hard to debug crashes on OS X. See here for more
  // info:
  //
  //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
  char format[] = "%lf";

  if (length <= bufferSize) {
    Char buffer[bufferSize + 1];
    memcpy(buffer, token.start_, length);
    buffer[length] = 0;
    count = sscanf(buffer, format, &value);
  } else {
    std::string buffer(token.start_, token.end_);
    count = sscanf(buffer.c_str(), format, &value);
  }

  if (count != 1)
    return addError("'" + std::string(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}